

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

handle pybind11::detail::type_caster<Eigen::Matrix<double,1,1,1,1,1>,void>::
       cast_impl<Eigen::Matrix<double,1,1,1,1,1>>
                 (Matrix<double,_1,_1,_1,_1,_1> *src,return_value_policy policy,handle parent)

{
  Matrix<double,_1,_1,_1,_1,_1> *this;
  cast_error *this_00;
  undefined7 in_register_00000031;
  handle local_40;
  PyObject *local_38;
  handle local_30;
  return_value_policy local_21;
  Matrix<double,_1,_1,_1,_1,_1> *pMStack_20;
  return_value_policy policy_local;
  Matrix<double,_1,_1,_1,_1,_1> *src_local;
  handle parent_local;
  
  local_21 = policy;
  pMStack_20 = src;
  src_local = (Matrix<double,_1,_1,_1,_1,_1> *)parent.m_ptr;
  switch(policy) {
  case automatic:
  case take_ownership:
    parent_local = eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>,void>
                             (src);
    break;
  case automatic_reference:
  case reference:
    none::none((none *)&local_40);
    local_38 = local_40.m_ptr;
    parent_local = eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>>
                             (src,local_40);
    none::~none((none *)&local_40);
    break;
  case copy:
    memset(&local_30,0,8);
    handle::handle(&local_30);
    parent_local = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>>
                             (src,local_30,true);
    break;
  case move:
    this = (Matrix<double,_1,_1,_1,_1,_1> *)
           Eigen::PlainObjectBase<Eigen::Matrix<double,1,1,1,1,1>>::operator_new
                     ((PlainObjectBase<Eigen::Matrix<double,1,1,1,1,1>> *)0x8,
                      CONCAT71(in_register_00000031,policy));
    Eigen::Matrix<double,_1,_1,_1,_1,_1>::Matrix(this,pMStack_20);
    parent_local = eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>,void>
                             (this);
    break;
  case reference_internal:
    parent_local = eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>>
                             (src,parent);
    break;
  default:
    this_00 = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this_00,"unhandled return_value_policy: should not happen!");
    __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
  }
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast_impl(CType *src, return_value_policy policy, handle parent) {
        switch (policy) {
            case return_value_policy::take_ownership:
            case return_value_policy::automatic:
                return eigen_encapsulate<props>(src);
            case return_value_policy::move:
                return eigen_encapsulate<props>(new CType(std::move(*src)));
            case return_value_policy::copy:
                return eigen_array_cast<props>(*src);
            case return_value_policy::reference:
            case return_value_policy::automatic_reference:
                return eigen_ref_array<props>(*src);
            case return_value_policy::reference_internal:
                return eigen_ref_array<props>(*src, parent);
            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        };
    }